

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O0

void ftmgr_timedout(ftmgr *ftmgr)

{
  char cVar1;
  int local_1c;
  int i;
  int tts;
  int seq;
  ftmgr *ftmgr_local;
  
  i = -1;
  cVar1 = '\0';
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    ftmgr->ftq[local_1c].tts = ftmgr->ftq[local_1c].tts + -1;
    if ((((uint)ftmgr->bitmap & 1 << ((byte)local_1c & 0x1f)) == 0) &&
       (ftmgr->ftq[local_1c].tts < cVar1)) {
      i = local_1c;
      cVar1 = ftmgr->ftq[local_1c].tts;
    }
  }
  if (i != -1) {
    ftmgr->ftq[i].tts = ftmgr->tts;
    fm_write(ftmgr->chmgr,(char)i + ' ',ftmgr->ftq[i].blk,ftmgr->ftq[i].size);
  }
  return;
}

Assistant:

void ftmgr_timedout(struct ftmgr *ftmgr)
{
    int seq = -1, tts = 0;
    for(int i = 0;i < FTQ_NR;i++) {
        ftmgr->ftq[i].tts--;
        if(!(ftmgr->bitmap & (1 << i)) && ftmgr->ftq[i].tts < tts) {
            seq = i;
            tts = ftmgr->ftq[i].tts;
        }
    }

    if(seq != -1) {
        ftmgr->ftq[seq].tts = ftmgr->tts;
        fm_write(ftmgr->chmgr, CTRL_BLK_SEQ0 + seq, ftmgr->ftq[seq].blk, ftmgr->ftq[seq].size);
    }
}